

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O1

bool __thiscall
duckdb::StreamQueryResult::IsOpenInternal(StreamQueryResult *this,ClientContextLock *lock)

{
  byte bVar1;
  ClientContext *pCVar2;
  pointer pAVar3;
  
  bVar1 = (this->super_QueryResult).super_BaseQueryResult.success ^ 1U |
          (this->context).internal.
          super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0;
  if (bVar1 == 0) {
    pCVar2 = shared_ptr<duckdb::ClientContext,_true>::operator->(&this->context);
    if ((pCVar2->active_query).
        super_unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ActiveQueryContext_*,_std::default_delete<duckdb::ActiveQueryContext>_>
        .super__Head_base<0UL,_duckdb::ActiveQueryContext_*,_false>._M_head_impl ==
        (ActiveQueryContext *)0x0) {
      bVar1 = 1;
    }
    else {
      pAVar3 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
               ::operator->(&pCVar2->active_query);
      bVar1 = (StreamQueryResult *)pAVar3->open_result != this;
    }
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool StreamQueryResult::IsOpenInternal(ClientContextLock &lock) {
	bool invalidated = !success || !context;
	if (!invalidated) {
		invalidated = !context->IsActiveResult(lock, *this);
	}
	return !invalidated;
}